

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mfcc.cpp
# Opt level: O1

int main(void)

{
  FILE *__stream;
  size_type __new_size;
  ostream *poVar1;
  char *__s;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ifile_data;
  Mat_<double> mel;
  Mat_<double> mel2;
  fstream ifile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  long *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  long *local_2f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f0;
  Mat_<double> local_2e8;
  Mat_<double> local_288;
  long local_228 [4];
  byte abStack_208 [496];
  
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream(local_228,"/home/toson/CLionProjects/MFCC/y.bin",_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_228,_S_beg);
    __new_size = std::istream::tellg();
    std::istream::seekg((long)local_228,_S_beg);
    local_2e8.super_Mat = (Mat)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_328,__new_size,(value_type_conflict2 *)&local_2e8);
    std::istream::read((char *)local_228,
                       (long)local_328.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    std::fstream::close();
    std::chrono::_V2::system_clock::now();
    pcen(&local_2e8,&local_328,16000);
    std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"all cost: ",10);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2e8._8_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2e8._12_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    pcen(&local_288,&local_328,16000);
    std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"all2 cost: ",0xb);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    __stream = _stdout;
    cv::Formatter::get(&local_2f8,0);
    (**(code **)(*local_2f8 + 0x10))(&local_308,local_2f8,&local_288);
    (**(code **)(*local_308 + 8))();
    __s = (char *)(**(code **)*local_308)();
    while (__s != (char *)0x0) {
      fputs(__s,__stream);
      __s = (char *)(**(code **)*local_308)();
    }
    if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
    }
    if (local_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0);
    }
    cv::Mat::~Mat(&local_288.super_Mat);
    cv::Mat::~Mat(&local_2e8.super_Mat);
    iVar2 = 0;
  }
  else {
    puts("It is no file: y.bin");
    iVar2 = -1;
  }
  std::fstream::~fstream(local_228);
  if (local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int main() {
//    // 读取文件
//    Wav wav("raw.wav", nSamplesPerSec);
//    wav.WavToBuffer();
//    if (wav.thislabel == 1) {
//        std::cout << "wav.thislabel == 1" << std::endl;
//        return -1;
//    }
//    std::cout << "SampleRate: " << wav.waveformatex.SampleRate << " Hz" << std::endl;

    //我读取的wav数据和Python(librosa)读出来的不一样，深入检查未排查到原因。
    // 于是我将python里读取的wav数据保存了下来（张尚龙python代码读取的wav数据）
    // 现在载入该数据：
    unsigned long ifile_length = 0;
    std::vector<uint8_t> ifile_data; //wav数据
    std::fstream ifile("/home/toson/CLionProjects/MFCC/y.bin", std::ios::in);//使用python导出的wav数据
    if (ifile) {
        ifile.seekg(0, std::ios::end);                  // go to the end
        ifile_length = (unsigned long) ifile.tellg();   // report location (this is the length)
        ifile.seekg(0, std::ios::beg);                  // go back to the beginning
        ifile_data.resize(ifile_length, 0);
        ifile.read((char *) ifile_data.data(), ifile_length);
        ifile.close();
    } else {
        printf("It is no file: y.bin\n");
        return -1;
    }

    auto stime = NowTime<milliseconds>();
    // 运算mel特征向量 //11ms
    //auto mel = log_mel(ifile_data, 16000);
    auto mel = pcen(ifile_data, 16000);
    auto etime = NowTime<milliseconds>();
    std::cout << "all cost: " << etime - stime << std::endl;

    std::cout << "[" << mel.rows << ", " << mel.cols << "]" << std::endl;
//    cv::print(mel);

    // 首次运算会多使用5ms，生成mel滤波器用。
    //auto mel2 = log_mel(ifile_data, 16000);
    auto mel2 = pcen(ifile_data, 16000);
    auto etime2 = NowTime<milliseconds>();
    std::cout << "all2 cost: " << etime2 - etime << std::endl;
    cv::print(mel2);
//    for (int j = 0; j < mel2.rows; j++) {
//        for (int i = 0; i < mel2.cols; i++) {
//            std::cout << "[ " << j << " , " << i << " ]: " << mel2(j, i) << std::endl;
//        }
//    }
//    std::cout << std::endl;

    //保存为文件
//    std::fstream ofile("out_mel.csv", std::ios::out);
//    if (ofile) {
//        for (int i = 0; i < mel.shape().rows; i++) {
//            for (int j = 0; j < mel.shape().cols; j++) {
//                ofile << mel(i, j) << " ";
//            }
//            ofile << std::endl;
//        }
//        ofile.close();
//    }
//    std::cout << R"(Save as "out_mel.csv")" << std::endl;

    return 0;
}